

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

void backward::SignalHandling::handleSignal(int param_1,siginfo_t *info,void *_ctx)

{
  long in_RDX;
  siginfo_t *in_RSI;
  Printer printer;
  void *error_addr;
  StackTrace st;
  ucontext_t *uctx;
  Printer *in_stack_fffffffffffffed0;
  void *in_stack_fffffffffffffee0;
  void *in_stack_fffffffffffffee8;
  void *in_stack_fffffffffffffef0;
  StackTraceImpl<backward::system_tag::linux_tag> *in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff00;
  void *in_stack_ffffffffffffff08;
  StackTraceImpl<backward::system_tag::linux_tag> *in_stack_ffffffffffffff10;
  
  StackTrace::StackTrace((StackTrace *)0x11d9eb);
  if (*(long *)(in_RDX + 0xa8) == 0) {
    StackTraceImpl<backward::system_tag::linux_tag>::load_here
              (in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8
               ,in_stack_fffffffffffffee0);
  }
  else {
    StackTraceImpl<backward::system_tag::linux_tag>::load_from
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  }
  Printer::Printer(in_stack_fffffffffffffed0);
  Printer::print<backward::StackTrace>
            ((Printer *)
             printer._resolver.super_TraceResolverImpl<backward::system_tag::linux_tag>.
             super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>._symbols.
             _val,(StackTrace *)
                  printer._resolver.super_TraceResolverImpl<backward::system_tag::linux_tag>.
                  super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>.
                  super_TraceResolverLinuxBase._88_8_,
             (FILE *)printer._resolver.super_TraceResolverImpl<backward::system_tag::linux_tag>.
                     super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>.
                     super_TraceResolverLinuxBase._80_8_);
  psiginfo(in_RSI,(char *)0x0);
  Printer::~Printer(in_stack_fffffffffffffed0);
  StackTrace::~StackTrace((StackTrace *)0x11dae7);
  return;
}

Assistant:

static void handleSignal(int, siginfo_t *info, void *_ctx) {
    ucontext_t *uctx = static_cast<ucontext_t *>(_ctx);

    StackTrace st;
    void *error_addr = nullptr;
#ifdef REG_RIP // x86_64
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext.gregs[REG_RIP]);
#elif defined(REG_EIP) // x86_32
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext.gregs[REG_EIP]);
#elif defined(__arm__)
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext.arm_pc);
#elif defined(__aarch64__)
    #if defined(__APPLE__)
      error_addr = reinterpret_cast<void *>(uctx->uc_mcontext->__ss.__pc);
    #else
      error_addr = reinterpret_cast<void *>(uctx->uc_mcontext.pc);
    #endif
#elif defined(__mips__)
    error_addr = reinterpret_cast<void *>(
        reinterpret_cast<struct sigcontext *>(&uctx->uc_mcontext)->sc_pc);
#elif defined(__ppc__) || defined(__powerpc) || defined(__powerpc__) ||        \
    defined(__POWERPC__)
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext.regs->nip);
#elif defined(__riscv)
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext.__gregs[REG_PC]);
#elif defined(__s390x__)
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext.psw.addr);
#elif defined(__APPLE__) && defined(__x86_64__)
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext->__ss.__rip);
#elif defined(__APPLE__)
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext->__ss.__eip);
#else
#warning ":/ sorry, ain't know no nothing none not of your architecture!"
#endif
    if (error_addr) {
      st.load_from(error_addr, 32, reinterpret_cast<void *>(uctx),
                   info->si_addr);
    } else {
      st.load_here(32, reinterpret_cast<void *>(uctx), info->si_addr);
    }

    Printer printer;
    printer.address = true;
    printer.print(st, stderr);

#if (defined(_XOPEN_SOURCE) && _XOPEN_SOURCE >= 700) || \
    (defined(_POSIX_C_SOURCE) && _POSIX_C_SOURCE >= 200809L)
    psiginfo(info, nullptr);
#else
    (void)info;
#endif
  }